

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prod_tests1.cpp
# Opt level: O2

void __thiscall
test::prod_test::iu_PeepTest_x_iutest_x_Function_Test::Body
          (iu_PeepTest_x_iutest_x_Function_Test *this)

{
  code *pcVar1;
  int *in_R9;
  iuCodeMessage local_1f0;
  AssertionResult iutest_ar;
  Fixed local_198;
  
  pcVar1 = iutest::detail::peep_tag<test::prod_test::iu_peep_tag_SetX<test::prod_test::ProdClass>>::
           value;
  if (((ulong)iutest::detail::
              peep_tag<test::prod_test::iu_peep_tag_SetX<test::prod_test::ProdClass>>::value & 1) !=
      0) {
    pcVar1 = *(code **)(iutest::detail::
                        peep_tag<test::prod_test::iu_peep_tag_SetX<test::prod_test::ProdClass>>::
                        value + *(long *)(s_prod + DAT_003aa308) + -1);
  }
  (*pcVar1)(s_prod + DAT_003aa308,100);
  local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = 100;
  local_1f0.m_message._M_dataplus._M_p._0_4_ = s_prod._4_4_;
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)0x313d92,"s_prod.GetX()",(char *)&local_198,(int *)&local_1f0,
             in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0xfd,iutest_ar.m_message._M_dataplus._M_p);
    local_1f0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f0,&local_198);
    std::__cxx11::string::~string((string *)&local_1f0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = 100;
  pcVar1 = iutest::detail::
           peep_tag<test::prod_test::iu_peep_tag_ConstGetX<test::prod_test::ProdClass>>::value;
  if (((ulong)iutest::detail::
              peep_tag<test::prod_test::iu_peep_tag_ConstGetX<test::prod_test::ProdClass>>::value &
      1) != 0) {
    pcVar1 = *(code **)(iutest::detail::
                        peep_tag<test::prod_test::iu_peep_tag_ConstGetX<test::prod_test::ProdClass>>
                        ::value + *(long *)(s_prod + _DAT_003aa328) + -1);
  }
  local_1f0.m_message._M_dataplus._M_p._0_4_ = (*pcVar1)(s_prod + _DAT_003aa328);
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)0x313d92,
             "(s_prod.*::iutest::detail::peep_tag< iu_peep_tag_ConstGetX<ProdClass> >::value)()",
             (char *)&local_198,(int *)&local_1f0,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0xfe,iutest_ar.m_message._M_dataplus._M_p);
    local_1f0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f0,&local_198);
    std::__cxx11::string::~string((string *)&local_1f0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(PeepTest, Function)
{
    IUTEST_PEEP_GET(s_prod, ProdClass, SetX)(100);
    IUTEST_EXPECT_EQ(100, s_prod.GetX());
    IUTEST_EXPECT_EQ(100, IUTEST_PEEP_GET(s_prod, ProdClass, ConstGetX)());
}